

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O1

size_t ZSTD_compressBlock_lazy2_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong *puVar4;
  ulong *iEnd;
  undefined8 *puVar5;
  ulong *puVar6;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  BYTE *pBVar11;
  BYTE *pBVar12;
  U32 *pUVar13;
  U32 *pUVar14;
  seqDef *psVar15;
  bool bVar16;
  undefined8 uVar17;
  char cVar18;
  BYTE *pBVar19;
  size_t sVar20;
  BYTE *pBVar21;
  BYTE *pBVar22;
  ulong uVar23;
  U32 UVar24;
  U32 UVar25;
  ulong *puVar26;
  ulong *puVar27;
  BYTE *pBVar28;
  BYTE *pBVar29;
  int iVar30;
  int iVar31;
  uint uVar32;
  uint uVar33;
  BYTE *iStart;
  ulong *puVar34;
  ulong *puVar35;
  long lVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong *puVar43;
  uint uVar44;
  ulong uVar45;
  int iVar46;
  uint uVar47;
  BYTE *base;
  int iVar48;
  uint uVar49;
  U32 UVar50;
  U32 maxDistance;
  BYTE *litLimit_w;
  ulong local_140;
  BYTE *local_100;
  ulong local_f8;
  ulong *local_e8;
  ulong *local_b8;
  
  iEnd = (ulong *)((long)src + srcSize);
  puVar6 = (ulong *)((long)src + (srcSize - 8));
  pBVar11 = (ms->window).base;
  uVar8 = (ms->window).dictLimit;
  iStart = pBVar11 + uVar8;
  uVar47 = *rep;
  uVar39 = rep[1];
  puVar43 = (ulong *)((ulong)(iStart == (BYTE *)src) + (long)src);
  local_b8 = (ulong *)src;
  if (puVar43 < puVar6) {
    pBVar12 = (ms->window).dictBase;
    puVar26 = (ulong *)(pBVar12 + uVar8);
    uVar9 = (ms->window).lowLimit;
    uVar37 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
    iVar30 = uVar8 - 1;
    puVar1 = (ulong *)((long)iEnd - 7);
    puVar2 = (ulong *)((long)iEnd - 3);
    puVar3 = (ulong *)((long)iEnd - 1);
    puVar4 = iEnd + -4;
    do {
      iVar46 = (int)puVar43 - (int)pBVar11;
      iVar48 = iVar46 + 1;
      UVar50 = (ms->window).lowLimit;
      UVar25 = ms->loadedDictEnd;
      UVar24 = iVar48 - uVar37;
      if (iVar48 - UVar50 <= uVar37) {
        UVar24 = UVar50;
      }
      if (UVar25 != 0) {
        UVar24 = UVar50;
      }
      uVar49 = iVar48 - uVar47;
      pBVar28 = pBVar11;
      if (uVar49 < uVar8) {
        pBVar28 = pBVar12;
      }
      if (iVar30 - uVar49 < 3) {
        pBVar19 = (BYTE *)0x0;
      }
      else {
        pBVar19 = (BYTE *)0x0;
        if (uVar47 < (iVar46 - UVar24) + 1) {
          if (*(int *)((long)puVar43 + 1U) == *(int *)(pBVar28 + uVar49)) {
            puVar34 = iEnd;
            if (uVar49 < uVar8) {
              puVar34 = puVar26;
            }
            sVar20 = ZSTD_count_2segments
                               ((BYTE *)((long)puVar43 + 5),(BYTE *)((long)(pBVar28 + uVar49) + 4),
                                (BYTE *)iEnd,(BYTE *)puVar34,iStart);
            pBVar19 = (BYTE *)(sVar20 + 4);
          }
          else {
            pBVar19 = (BYTE *)0x0;
          }
        }
      }
      uVar49 = (ms->cParams).minMatch;
      if (uVar49 - 6 < 2) {
        bVar7 = (byte)(ms->cParams).chainLog;
        uVar38 = 1 << (bVar7 & 0x1f);
        pBVar28 = (ms->window).base;
        pBVar29 = (ms->window).dictBase;
        uVar32 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
        uVar49 = (uint)((long)puVar43 - (long)pBVar28);
        UVar24 = uVar49 - uVar32;
        if (uVar49 - UVar50 <= uVar32) {
          UVar24 = UVar50;
        }
        uVar32 = (ms->window).dictLimit;
        if (UVar25 != 0) {
          UVar24 = UVar50;
        }
        uVar33 = uVar49 - uVar38;
        if (uVar49 < uVar38) {
          uVar33 = 0;
        }
        pUVar13 = ms->chainTable;
        iVar48 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
        pUVar14 = ms->hashTable;
        uVar40 = (ulong)ms->nextToUpdate;
        cVar18 = (char)(ms->cParams).hashLog;
        if (ms->nextToUpdate < uVar49) {
          do {
            uVar45 = (ulong)(*(long *)(pBVar28 + uVar40) * -0x30e4432340650000) >>
                     (0x40U - cVar18 & 0x3f);
            pUVar13[(uint)uVar40 & ~(-1 << (bVar7 & 0x1f))] = pUVar14[uVar45];
            pUVar14[uVar45] = (uint)uVar40;
            uVar40 = uVar40 + 1;
          } while (uVar40 < ((long)puVar43 - (long)pBVar28 & 0xffffffffU));
        }
        ms->nextToUpdate = uVar49;
        uVar40 = *puVar43;
        uVar44 = pUVar14[uVar40 * -0x30e4432340650000 >> (-cVar18 & 0x3fU)];
        if (uVar44 < UVar24) goto LAB_0061b695;
        local_f8 = 999999999;
        pBVar22 = (BYTE *)0x3;
        do {
          if (uVar44 < uVar32) {
            if (*(int *)(pBVar29 + uVar44) == (int)*puVar43) {
              sVar20 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar43 + 4),pBVar29 + (ulong)uVar44 + 4,
                                  (BYTE *)iEnd,pBVar29 + uVar32,pBVar28 + uVar32);
              pBVar21 = (BYTE *)(sVar20 + 4);
            }
            else {
LAB_0061b21e:
              pBVar21 = (BYTE *)0x0;
            }
          }
          else {
            puVar34 = (ulong *)(pBVar28 + uVar44);
            if (pBVar22[(long)puVar34] != *(BYTE *)((long)puVar43 + (long)pBVar22))
            goto LAB_0061b21e;
            puVar35 = puVar43;
            if (puVar43 < puVar1) {
              uVar23 = *puVar34 ^ uVar40;
              uVar45 = 0;
              if (uVar23 != 0) {
                for (; (uVar23 >> uVar45 & 1) == 0; uVar45 = uVar45 + 1) {
                }
              }
              pBVar21 = (BYTE *)(uVar45 >> 3 & 0x1fffffff);
              if (*puVar34 == uVar40) {
                do {
                  puVar35 = puVar35 + 1;
                  puVar34 = puVar34 + 1;
                  if (puVar1 <= puVar35) goto LAB_0061b222;
                  uVar23 = *puVar35 ^ *puVar34;
                  uVar45 = 0;
                  if (uVar23 != 0) {
                    for (; (uVar23 >> uVar45 & 1) == 0; uVar45 = uVar45 + 1) {
                    }
                  }
                  pBVar21 = (BYTE *)((long)puVar35 + ((uVar45 >> 3 & 0x1fffffff) - (long)puVar43));
                } while (*puVar34 == *puVar35);
              }
            }
            else {
LAB_0061b222:
              if ((puVar35 < puVar2) && ((int)*puVar34 == (int)*puVar35)) {
                puVar35 = (ulong *)((long)puVar35 + 4);
                puVar34 = (ulong *)((long)puVar34 + 4);
              }
              if ((puVar35 < puVar3) && ((short)*puVar34 == (short)*puVar35)) {
                puVar35 = (ulong *)((long)puVar35 + 2);
                puVar34 = (ulong *)((long)puVar34 + 2);
              }
              if (puVar35 < iEnd) {
                puVar35 = (ulong *)((long)puVar35 + (ulong)((BYTE)*puVar34 == (BYTE)*puVar35));
              }
              pBVar21 = (BYTE *)((long)puVar35 - (long)puVar43);
            }
          }
          if ((pBVar22 < pBVar21) &&
             (local_f8 = (ulong)((uVar49 + 2) - uVar44), pBVar22 = pBVar21,
             (ulong *)((long)puVar43 + (long)pBVar21) == iEnd)) {
            bVar16 = false;
          }
          else {
            pBVar21 = pBVar22;
            if (uVar33 < uVar44) {
              uVar44 = pUVar13[uVar44 & uVar38 - 1];
              bVar16 = true;
            }
            else {
              bVar16 = false;
            }
          }
        } while (((bVar16) && (UVar24 <= uVar44)) &&
                (iVar48 = iVar48 + -1, pBVar22 = pBVar21, iVar48 != 0));
      }
      else if (uVar49 == 5) {
        bVar7 = (byte)(ms->cParams).chainLog;
        uVar38 = 1 << (bVar7 & 0x1f);
        pBVar28 = (ms->window).base;
        pBVar29 = (ms->window).dictBase;
        uVar32 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
        uVar49 = (uint)((long)puVar43 - (long)pBVar28);
        UVar24 = uVar49 - uVar32;
        if (uVar49 - UVar50 <= uVar32) {
          UVar24 = UVar50;
        }
        uVar32 = (ms->window).dictLimit;
        if (UVar25 != 0) {
          UVar24 = UVar50;
        }
        uVar33 = uVar49 - uVar38;
        if (uVar49 < uVar38) {
          uVar33 = 0;
        }
        pUVar13 = ms->chainTable;
        iVar48 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
        pUVar14 = ms->hashTable;
        uVar40 = (ulong)ms->nextToUpdate;
        cVar18 = (char)(ms->cParams).hashLog;
        if (ms->nextToUpdate < uVar49) {
          do {
            uVar45 = (ulong)(*(long *)(pBVar28 + uVar40) * -0x30e4432345000000) >>
                     (0x40U - cVar18 & 0x3f);
            pUVar13[(uint)uVar40 & ~(-1 << (bVar7 & 0x1f))] = pUVar14[uVar45];
            pUVar14[uVar45] = (uint)uVar40;
            uVar40 = uVar40 + 1;
          } while (uVar40 < ((long)puVar43 - (long)pBVar28 & 0xffffffffU));
        }
        ms->nextToUpdate = uVar49;
        uVar40 = *puVar43;
        uVar44 = pUVar14[uVar40 * -0x30e4432345000000 >> (-cVar18 & 0x3fU)];
        if (uVar44 < UVar24) {
LAB_0061b695:
          pBVar21 = (BYTE *)0x3;
          local_f8 = 999999999;
        }
        else {
          local_f8 = 999999999;
          pBVar22 = (BYTE *)0x3;
          do {
            if (uVar44 < uVar32) {
              if (*(int *)(pBVar29 + uVar44) == (int)*puVar43) {
                sVar20 = ZSTD_count_2segments
                                   ((BYTE *)((long)puVar43 + 4),pBVar29 + (ulong)uVar44 + 4,
                                    (BYTE *)iEnd,pBVar29 + uVar32,pBVar28 + uVar32);
                pBVar21 = (BYTE *)(sVar20 + 4);
              }
              else {
LAB_0061b4f2:
                pBVar21 = (BYTE *)0x0;
              }
            }
            else {
              puVar34 = (ulong *)(pBVar28 + uVar44);
              if (pBVar22[(long)puVar34] != *(BYTE *)((long)puVar43 + (long)pBVar22))
              goto LAB_0061b4f2;
              puVar35 = puVar43;
              if (puVar43 < puVar1) {
                uVar23 = *puVar34 ^ uVar40;
                uVar45 = 0;
                if (uVar23 != 0) {
                  for (; (uVar23 >> uVar45 & 1) == 0; uVar45 = uVar45 + 1) {
                  }
                }
                pBVar21 = (BYTE *)(uVar45 >> 3 & 0x1fffffff);
                if (*puVar34 == uVar40) {
                  do {
                    puVar35 = puVar35 + 1;
                    puVar34 = puVar34 + 1;
                    if (puVar1 <= puVar35) goto LAB_0061b4f6;
                    uVar23 = *puVar35 ^ *puVar34;
                    uVar45 = 0;
                    if (uVar23 != 0) {
                      for (; (uVar23 >> uVar45 & 1) == 0; uVar45 = uVar45 + 1) {
                      }
                    }
                    pBVar21 = (BYTE *)((long)puVar35 + ((uVar45 >> 3 & 0x1fffffff) - (long)puVar43))
                    ;
                  } while (*puVar34 == *puVar35);
                }
              }
              else {
LAB_0061b4f6:
                if ((puVar35 < puVar2) && ((int)*puVar34 == (int)*puVar35)) {
                  puVar35 = (ulong *)((long)puVar35 + 4);
                  puVar34 = (ulong *)((long)puVar34 + 4);
                }
                if ((puVar35 < puVar3) && ((short)*puVar34 == (short)*puVar35)) {
                  puVar35 = (ulong *)((long)puVar35 + 2);
                  puVar34 = (ulong *)((long)puVar34 + 2);
                }
                if (puVar35 < iEnd) {
                  puVar35 = (ulong *)((long)puVar35 + (ulong)((BYTE)*puVar34 == (BYTE)*puVar35));
                }
                pBVar21 = (BYTE *)((long)puVar35 - (long)puVar43);
              }
            }
            if ((pBVar22 < pBVar21) &&
               (local_f8 = (ulong)((uVar49 + 2) - uVar44), pBVar22 = pBVar21,
               (ulong *)((long)puVar43 + (long)pBVar21) == iEnd)) {
              bVar16 = false;
            }
            else {
              pBVar21 = pBVar22;
              if (uVar33 < uVar44) {
                uVar44 = pUVar13[uVar44 & uVar38 - 1];
                bVar16 = true;
              }
              else {
                bVar16 = false;
              }
            }
          } while (((bVar16) && (UVar24 <= uVar44)) &&
                  (iVar48 = iVar48 + -1, pBVar22 = pBVar21, iVar48 != 0));
        }
      }
      else {
        bVar7 = (byte)(ms->cParams).chainLog;
        uVar38 = 1 << (bVar7 & 0x1f);
        pBVar28 = (ms->window).base;
        pBVar29 = (ms->window).dictBase;
        uVar32 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
        uVar49 = (uint)((long)puVar43 - (long)pBVar28);
        UVar24 = uVar49 - uVar32;
        if (uVar49 - UVar50 <= uVar32) {
          UVar24 = UVar50;
        }
        uVar32 = (ms->window).dictLimit;
        if (UVar25 != 0) {
          UVar24 = UVar50;
        }
        uVar33 = uVar49 - uVar38;
        if (uVar49 < uVar38) {
          uVar33 = 0;
        }
        pUVar13 = ms->chainTable;
        iVar48 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
        pUVar14 = ms->hashTable;
        uVar40 = (ulong)ms->nextToUpdate;
        cVar18 = (char)(ms->cParams).hashLog;
        if (ms->nextToUpdate < uVar49) {
          do {
            uVar44 = (uint)(*(int *)(pBVar28 + uVar40) * -0x61c8864f) >> (0x20U - cVar18 & 0x1f);
            pUVar13[(uint)uVar40 & ~(-1 << (bVar7 & 0x1f))] = pUVar14[uVar44];
            pUVar14[uVar44] = (uint)uVar40;
            uVar40 = uVar40 + 1;
          } while (uVar40 < ((long)puVar43 - (long)pBVar28 & 0xffffffffU));
        }
        ms->nextToUpdate = uVar49;
        uVar40 = *puVar43;
        uVar44 = pUVar14[(uint)((int)uVar40 * -0x61c8864f) >> (-cVar18 & 0x1fU)];
        if (uVar44 < UVar24) goto LAB_0061b695;
        local_f8 = 999999999;
        pBVar22 = (BYTE *)0x3;
        do {
          if (uVar44 < uVar32) {
            if (*(int *)(pBVar29 + uVar44) == (int)uVar40) {
              sVar20 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar43 + 4),pBVar29 + (ulong)uVar44 + 4,
                                  (BYTE *)iEnd,pBVar29 + uVar32,pBVar28 + uVar32);
              pBVar21 = (BYTE *)(sVar20 + 4);
            }
            else {
LAB_0061cec8:
              pBVar21 = (BYTE *)0x0;
            }
          }
          else {
            puVar34 = (ulong *)(pBVar28 + uVar44);
            if (pBVar22[(long)puVar34] != *(BYTE *)((long)puVar43 + (long)pBVar22))
            goto LAB_0061cec8;
            puVar35 = puVar43;
            if (puVar43 < puVar1) {
              uVar23 = *puVar43 ^ *puVar34;
              uVar45 = 0;
              if (uVar23 != 0) {
                for (; (uVar23 >> uVar45 & 1) == 0; uVar45 = uVar45 + 1) {
                }
              }
              pBVar21 = (BYTE *)(uVar45 >> 3 & 0x1fffffff);
              if (*puVar34 == *puVar43) {
                do {
                  puVar35 = puVar35 + 1;
                  puVar34 = puVar34 + 1;
                  if (puVar1 <= puVar35) goto LAB_0061cecf;
                  uVar23 = *puVar35 ^ *puVar34;
                  uVar45 = 0;
                  if (uVar23 != 0) {
                    for (; (uVar23 >> uVar45 & 1) == 0; uVar45 = uVar45 + 1) {
                    }
                  }
                  pBVar21 = (BYTE *)((long)puVar35 + ((uVar45 >> 3 & 0x1fffffff) - (long)puVar43));
                } while (*puVar34 == *puVar35);
              }
            }
            else {
LAB_0061cecf:
              if ((puVar35 < puVar2) && ((int)*puVar34 == (int)*puVar35)) {
                puVar35 = (ulong *)((long)puVar35 + 4);
                puVar34 = (ulong *)((long)puVar34 + 4);
              }
              if ((puVar35 < puVar3) && ((short)*puVar34 == (short)*puVar35)) {
                puVar35 = (ulong *)((long)puVar35 + 2);
                puVar34 = (ulong *)((long)puVar34 + 2);
              }
              if (puVar35 < iEnd) {
                puVar35 = (ulong *)((long)puVar35 + (ulong)((BYTE)*puVar34 == (BYTE)*puVar35));
              }
              pBVar21 = (BYTE *)((long)puVar35 - (long)puVar43);
            }
          }
          if ((pBVar22 < pBVar21) &&
             (local_f8 = (ulong)((uVar49 + 2) - uVar44), pBVar22 = pBVar21,
             (ulong *)((long)puVar43 + (long)pBVar21) == iEnd)) {
            bVar16 = false;
          }
          else {
            pBVar21 = pBVar22;
            if (uVar33 < uVar44) {
              uVar44 = pUVar13[uVar44 & uVar38 - 1];
              bVar16 = true;
            }
            else {
              bVar16 = false;
            }
          }
        } while (((bVar16) && (UVar24 <= uVar44)) &&
                (iVar48 = iVar48 + -1, pBVar22 = pBVar21, iVar48 != 0));
      }
      local_100 = pBVar19;
      if (pBVar19 < pBVar21) {
        local_100 = pBVar21;
      }
      if (local_100 < (BYTE *)0x4) {
        puVar43 = (ulong *)((long)puVar43 + ((long)puVar43 - (long)local_b8 >> 8) + 1);
      }
      else {
        local_e8 = puVar43;
        if (pBVar21 <= pBVar19) {
          local_f8 = 0;
          local_e8 = (ulong *)((long)puVar43 + 1U);
        }
        do {
          do {
            puVar34 = puVar43;
            iVar48 = iVar46;
            if (puVar6 <= puVar34) goto LAB_0061ccef;
            puVar43 = (ulong *)((long)puVar34 + 1);
            iVar46 = iVar48 + 1;
            if (local_f8 == 0) {
              local_f8 = 0;
            }
            else {
              UVar50 = (ms->window).lowLimit;
              UVar25 = iVar46 - uVar37;
              if (iVar46 - UVar50 <= uVar37) {
                UVar25 = UVar50;
              }
              if (ms->loadedDictEnd != 0) {
                UVar25 = UVar50;
              }
              uVar49 = iVar46 - uVar47;
              pBVar28 = pBVar11;
              if (uVar49 < uVar8) {
                pBVar28 = pBVar12;
              }
              if (((2 < iVar30 - uVar49) && (uVar47 < iVar46 - UVar25)) &&
                 (*(int *)puVar43 == *(int *)(pBVar28 + uVar49))) {
                puVar35 = iEnd;
                if (uVar49 < uVar8) {
                  puVar35 = puVar26;
                }
                sVar20 = ZSTD_count_2segments
                                   ((BYTE *)((long)puVar34 + 5),
                                    (BYTE *)((long)(pBVar28 + uVar49) + 4),(BYTE *)iEnd,
                                    (BYTE *)puVar35,iStart);
                if (sVar20 < 0xfffffffffffffffc) {
                  uVar32 = (int)local_f8 + 1;
                  uVar49 = 0x1f;
                  if (uVar32 != 0) {
                    for (; uVar32 >> uVar49 == 0; uVar49 = uVar49 - 1) {
                    }
                  }
                  if ((int)((uVar49 ^ 0x1f) + (int)local_100 * 3 + -0x1e) <
                      (int)(BYTE *)(sVar20 + 4) * 3) {
                    local_f8 = 0;
                    local_100 = (BYTE *)(sVar20 + 4);
                    local_e8 = puVar43;
                  }
                }
              }
            }
            uVar49 = (ms->cParams).minMatch;
            if (uVar49 - 6 < 2) {
              bVar7 = (byte)(ms->cParams).chainLog;
              uVar38 = 1 << (bVar7 & 0x1f);
              pUVar13 = ms->chainTable;
              pBVar28 = (ms->window).base;
              pBVar19 = (ms->window).dictBase;
              uVar32 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
              UVar50 = (ms->window).lowLimit;
              uVar49 = (uint)((long)puVar43 - (long)pBVar28);
              UVar25 = uVar49 - uVar32;
              if (uVar49 - UVar50 <= uVar32) {
                UVar25 = UVar50;
              }
              if (ms->loadedDictEnd != 0) {
                UVar25 = UVar50;
              }
              uVar32 = uVar49 - uVar38;
              if (uVar49 < uVar38) {
                uVar32 = 0;
              }
              uVar33 = (ms->window).dictLimit;
              iVar31 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
              pUVar14 = ms->hashTable;
              uVar40 = (ulong)ms->nextToUpdate;
              cVar18 = (char)(ms->cParams).hashLog;
              if (ms->nextToUpdate < uVar49) {
                do {
                  uVar45 = (ulong)(*(long *)(pBVar28 + uVar40) * -0x30e4432340650000) >>
                           (0x40U - cVar18 & 0x3f);
                  pUVar13[(uint)uVar40 & ~(-1 << (bVar7 & 0x1f))] = pUVar14[uVar45];
                  pUVar14[uVar45] = (uint)uVar40;
                  uVar40 = uVar40 + 1;
                } while (((long)puVar43 - (long)pBVar28 & 0xffffffffU) != uVar40);
              }
              ms->nextToUpdate = uVar49;
              uVar45 = *puVar43;
              uVar44 = pUVar14[uVar45 * -0x30e4432340650000 >> (-cVar18 & 0x3fU)];
              if (uVar44 < UVar25) goto LAB_0061bf72;
              uVar40 = 999999999;
              pBVar29 = (BYTE *)0x3;
              do {
                if (uVar44 < uVar33) {
                  if (*(int *)(pBVar19 + uVar44) == *(int *)puVar43) {
                    sVar20 = ZSTD_count_2segments
                                       ((BYTE *)((long)puVar34 + 5),pBVar19 + (ulong)uVar44 + 4,
                                        (BYTE *)iEnd,pBVar19 + uVar33,pBVar28 + uVar33);
                    pBVar22 = (BYTE *)(sVar20 + 4);
                  }
                  else {
LAB_0061bace:
                    pBVar22 = (BYTE *)0x0;
                  }
                }
                else {
                  puVar35 = (ulong *)(pBVar28 + uVar44);
                  if (pBVar29[(long)puVar35] != *(BYTE *)((long)puVar43 + (long)pBVar29))
                  goto LAB_0061bace;
                  puVar27 = puVar43;
                  if (puVar43 < puVar1) {
                    uVar42 = *puVar35 ^ uVar45;
                    uVar23 = 0;
                    if (uVar42 != 0) {
                      for (; (uVar42 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
                      }
                    }
                    pBVar22 = (BYTE *)(uVar23 >> 3 & 0x1fffffff);
                    puVar27 = (ulong *)((long)puVar34 + 9);
                    if (*puVar35 == uVar45) {
                      do {
                        puVar35 = puVar35 + 1;
                        if (puVar1 <= puVar27) goto LAB_0061bad5;
                        uVar23 = *puVar27;
                        uVar41 = uVar23 ^ *puVar35;
                        uVar42 = 0;
                        if (uVar41 != 0) {
                          for (; (uVar41 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                          }
                        }
                        pBVar22 = (BYTE *)((long)puVar27 +
                                          ((uVar42 >> 3 & 0x1fffffff) - (long)puVar43));
                        puVar27 = puVar27 + 1;
                      } while (*puVar35 == uVar23);
                    }
                  }
                  else {
LAB_0061bad5:
                    if ((puVar27 < puVar2) && ((int)*puVar35 == (int)*puVar27)) {
                      puVar27 = (ulong *)((long)puVar27 + 4);
                      puVar35 = (ulong *)((long)puVar35 + 4);
                    }
                    if ((puVar27 < puVar3) && ((short)*puVar35 == (short)*puVar27)) {
                      puVar27 = (ulong *)((long)puVar27 + 2);
                      puVar35 = (ulong *)((long)puVar35 + 2);
                    }
                    if (puVar27 < iEnd) {
                      puVar27 = (ulong *)((long)puVar27 + (ulong)((BYTE)*puVar35 == (BYTE)*puVar27))
                      ;
                    }
                    pBVar22 = (BYTE *)((long)puVar27 - (long)puVar43);
                  }
                }
                if ((pBVar29 < pBVar22) &&
                   (uVar40 = (ulong)((uVar49 + 2) - uVar44), pBVar29 = pBVar22,
                   (ulong *)((long)puVar43 + (long)pBVar22) == iEnd)) {
                  bVar16 = false;
                }
                else {
                  pBVar22 = pBVar29;
                  if (uVar32 < uVar44) {
                    uVar44 = pUVar13[uVar44 & uVar38 - 1];
                    bVar16 = true;
                  }
                  else {
                    bVar16 = false;
                  }
                }
              } while (((bVar16) && (UVar25 <= uVar44)) &&
                      (iVar31 = iVar31 + -1, pBVar29 = pBVar22, iVar31 != 0));
            }
            else if (uVar49 == 5) {
              bVar7 = (byte)(ms->cParams).chainLog;
              uVar38 = 1 << (bVar7 & 0x1f);
              pUVar13 = ms->chainTable;
              pBVar28 = (ms->window).base;
              pBVar19 = (ms->window).dictBase;
              uVar32 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
              UVar50 = (ms->window).lowLimit;
              uVar49 = (uint)((long)puVar43 - (long)pBVar28);
              UVar25 = uVar49 - uVar32;
              if (uVar49 - UVar50 <= uVar32) {
                UVar25 = UVar50;
              }
              if (ms->loadedDictEnd != 0) {
                UVar25 = UVar50;
              }
              uVar32 = uVar49 - uVar38;
              if (uVar49 < uVar38) {
                uVar32 = 0;
              }
              uVar33 = (ms->window).dictLimit;
              iVar31 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
              pUVar14 = ms->hashTable;
              uVar40 = (ulong)ms->nextToUpdate;
              cVar18 = (char)(ms->cParams).hashLog;
              if (ms->nextToUpdate < uVar49) {
                do {
                  uVar45 = (ulong)(*(long *)(pBVar28 + uVar40) * -0x30e4432345000000) >>
                           (0x40U - cVar18 & 0x3f);
                  pUVar13[(uint)uVar40 & ~(-1 << (bVar7 & 0x1f))] = pUVar14[uVar45];
                  pUVar14[uVar45] = (uint)uVar40;
                  uVar40 = uVar40 + 1;
                } while (((long)puVar43 - (long)pBVar28 & 0xffffffffU) != uVar40);
              }
              ms->nextToUpdate = uVar49;
              uVar45 = *puVar43;
              uVar44 = pUVar14[uVar45 * -0x30e4432345000000 >> (-cVar18 & 0x3fU)];
              if (uVar44 < UVar25) {
LAB_0061bf72:
                pBVar22 = (BYTE *)0x3;
                uVar40 = 999999999;
              }
              else {
                uVar40 = 999999999;
                pBVar29 = (BYTE *)0x3;
                do {
                  if (uVar44 < uVar33) {
                    if (*(int *)(pBVar19 + uVar44) == *(int *)puVar43) {
                      sVar20 = ZSTD_count_2segments
                                         ((BYTE *)((long)puVar34 + 5),pBVar19 + (ulong)uVar44 + 4,
                                          (BYTE *)iEnd,pBVar19 + uVar33,pBVar28 + uVar33);
                      pBVar22 = (BYTE *)(sVar20 + 4);
                    }
                    else {
LAB_0061bdbf:
                      pBVar22 = (BYTE *)0x0;
                    }
                  }
                  else {
                    puVar35 = (ulong *)(pBVar28 + uVar44);
                    if (pBVar29[(long)puVar35] != *(BYTE *)((long)puVar43 + (long)pBVar29))
                    goto LAB_0061bdbf;
                    puVar27 = puVar43;
                    if (puVar43 < puVar1) {
                      uVar42 = *puVar35 ^ uVar45;
                      uVar23 = 0;
                      if (uVar42 != 0) {
                        for (; (uVar42 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
                        }
                      }
                      pBVar22 = (BYTE *)(uVar23 >> 3 & 0x1fffffff);
                      puVar27 = (ulong *)((long)puVar34 + 9);
                      if (*puVar35 == uVar45) {
                        do {
                          puVar35 = puVar35 + 1;
                          if (puVar1 <= puVar27) goto LAB_0061bdc6;
                          uVar23 = *puVar27;
                          uVar41 = uVar23 ^ *puVar35;
                          uVar42 = 0;
                          if (uVar41 != 0) {
                            for (; (uVar41 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                            }
                          }
                          pBVar22 = (BYTE *)((long)puVar27 +
                                            ((uVar42 >> 3 & 0x1fffffff) - (long)puVar43));
                          puVar27 = puVar27 + 1;
                        } while (*puVar35 == uVar23);
                      }
                    }
                    else {
LAB_0061bdc6:
                      if ((puVar27 < puVar2) && ((int)*puVar35 == (int)*puVar27)) {
                        puVar27 = (ulong *)((long)puVar27 + 4);
                        puVar35 = (ulong *)((long)puVar35 + 4);
                      }
                      if ((puVar27 < puVar3) && ((short)*puVar35 == (short)*puVar27)) {
                        puVar27 = (ulong *)((long)puVar27 + 2);
                        puVar35 = (ulong *)((long)puVar35 + 2);
                      }
                      if (puVar27 < iEnd) {
                        puVar27 = (ulong *)((long)puVar27 +
                                           (ulong)((BYTE)*puVar35 == (BYTE)*puVar27));
                      }
                      pBVar22 = (BYTE *)((long)puVar27 - (long)puVar43);
                    }
                  }
                  if ((pBVar29 < pBVar22) &&
                     (uVar40 = (ulong)((uVar49 + 2) - uVar44), pBVar29 = pBVar22,
                     (ulong *)((long)puVar43 + (long)pBVar22) == iEnd)) {
                    bVar16 = false;
                  }
                  else {
                    pBVar22 = pBVar29;
                    if (uVar32 < uVar44) {
                      uVar44 = pUVar13[uVar44 & uVar38 - 1];
                      bVar16 = true;
                    }
                    else {
                      bVar16 = false;
                    }
                  }
                } while (((bVar16) && (UVar25 <= uVar44)) &&
                        (iVar31 = iVar31 + -1, pBVar29 = pBVar22, iVar31 != 0));
              }
            }
            else {
              bVar7 = (byte)(ms->cParams).chainLog;
              uVar38 = 1 << (bVar7 & 0x1f);
              pUVar13 = ms->chainTable;
              pBVar28 = (ms->window).base;
              pBVar19 = (ms->window).dictBase;
              uVar32 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
              UVar50 = (ms->window).lowLimit;
              uVar49 = (uint)((long)puVar43 - (long)pBVar28);
              UVar25 = uVar49 - uVar32;
              if (uVar49 - UVar50 <= uVar32) {
                UVar25 = UVar50;
              }
              if (ms->loadedDictEnd != 0) {
                UVar25 = UVar50;
              }
              uVar32 = uVar49 - uVar38;
              if (uVar49 < uVar38) {
                uVar32 = 0;
              }
              uVar33 = (ms->window).dictLimit;
              iVar31 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
              pUVar14 = ms->hashTable;
              uVar40 = (ulong)ms->nextToUpdate;
              cVar18 = (char)(ms->cParams).hashLog;
              if (ms->nextToUpdate < uVar49) {
                do {
                  uVar44 = (uint)(*(int *)(pBVar28 + uVar40) * -0x61c8864f) >>
                           (0x20U - cVar18 & 0x1f);
                  pUVar13[(uint)uVar40 & ~(-1 << (bVar7 & 0x1f))] = pUVar14[uVar44];
                  pUVar14[uVar44] = (uint)uVar40;
                  uVar40 = uVar40 + 1;
                } while (((long)puVar43 - (long)pBVar28 & 0xffffffffU) != uVar40);
              }
              ms->nextToUpdate = uVar49;
              iVar10 = *(int *)puVar43;
              uVar44 = pUVar14[(uint)(iVar10 * -0x61c8864f) >> (-cVar18 & 0x1fU)];
              if (uVar44 < UVar25) goto LAB_0061bf72;
              uVar40 = 999999999;
              pBVar29 = (BYTE *)0x3;
              do {
                if (uVar44 < uVar33) {
                  if (*(int *)(pBVar19 + uVar44) == iVar10) {
                    sVar20 = ZSTD_count_2segments
                                       ((BYTE *)((long)puVar34 + 5),pBVar19 + (ulong)uVar44 + 4,
                                        (BYTE *)iEnd,pBVar19 + uVar33,pBVar28 + uVar33);
                    pBVar22 = (BYTE *)(sVar20 + 4);
                  }
                  else {
LAB_0061c860:
                    pBVar22 = (BYTE *)0x0;
                  }
                }
                else {
                  puVar35 = (ulong *)(pBVar28 + uVar44);
                  if (pBVar29[(long)puVar35] != *(BYTE *)((long)puVar43 + (long)pBVar29))
                  goto LAB_0061c860;
                  puVar27 = puVar43;
                  if (puVar43 < puVar1) {
                    uVar23 = *puVar43 ^ *puVar35;
                    uVar45 = 0;
                    if (uVar23 != 0) {
                      for (; (uVar23 >> uVar45 & 1) == 0; uVar45 = uVar45 + 1) {
                      }
                    }
                    pBVar22 = (BYTE *)(uVar45 >> 3 & 0x1fffffff);
                    puVar27 = (ulong *)((long)puVar34 + 9);
                    if (*puVar35 == *puVar43) {
                      do {
                        puVar35 = puVar35 + 1;
                        if (puVar1 <= puVar27) goto LAB_0061c867;
                        uVar45 = *puVar27;
                        uVar42 = uVar45 ^ *puVar35;
                        uVar23 = 0;
                        if (uVar42 != 0) {
                          for (; (uVar42 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
                          }
                        }
                        pBVar22 = (BYTE *)((long)puVar27 +
                                          ((uVar23 >> 3 & 0x1fffffff) - (long)puVar43));
                        puVar27 = puVar27 + 1;
                      } while (*puVar35 == uVar45);
                    }
                  }
                  else {
LAB_0061c867:
                    if ((puVar27 < puVar2) && ((int)*puVar35 == (int)*puVar27)) {
                      puVar27 = (ulong *)((long)puVar27 + 4);
                      puVar35 = (ulong *)((long)puVar35 + 4);
                    }
                    if ((puVar27 < puVar3) && ((short)*puVar35 == (short)*puVar27)) {
                      puVar27 = (ulong *)((long)puVar27 + 2);
                      puVar35 = (ulong *)((long)puVar35 + 2);
                    }
                    if (puVar27 < iEnd) {
                      puVar27 = (ulong *)((long)puVar27 + (ulong)((BYTE)*puVar35 == (BYTE)*puVar27))
                      ;
                    }
                    pBVar22 = (BYTE *)((long)puVar27 - (long)puVar43);
                  }
                }
                if ((pBVar29 < pBVar22) &&
                   (uVar40 = (ulong)((uVar49 + 2) - uVar44), pBVar29 = pBVar22,
                   (ulong *)((long)puVar43 + (long)pBVar22) == iEnd)) {
                  bVar16 = false;
                }
                else {
                  pBVar22 = pBVar29;
                  if (uVar32 < uVar44) {
                    uVar44 = pUVar13[uVar44 & uVar38 - 1];
                    bVar16 = true;
                  }
                  else {
                    bVar16 = false;
                  }
                }
              } while (((bVar16) && (UVar25 <= uVar44)) &&
                      (iVar31 = iVar31 + -1, pBVar29 = pBVar22, iVar31 != 0));
            }
            bVar16 = true;
            if ((BYTE *)0x3 < pBVar22) {
              uVar32 = (int)local_f8 + 1;
              uVar49 = 0x1f;
              if (uVar32 != 0) {
                for (; uVar32 >> uVar49 == 0; uVar49 = uVar49 - 1) {
                }
              }
              uVar32 = (int)uVar40 + 1;
              iVar31 = 0x1f;
              if (uVar32 != 0) {
                for (; uVar32 >> iVar31 == 0; iVar31 = iVar31 + -1) {
                }
              }
              if ((int)((uVar49 ^ 0x1f) + (int)local_100 * 4 + -0x1b) < (int)pBVar22 * 4 - iVar31) {
                bVar16 = false;
                local_f8 = uVar40;
                local_100 = pBVar22;
                local_e8 = puVar43;
              }
            }
          } while (!bVar16);
          if (puVar6 <= puVar43) break;
          puVar43 = (ulong *)((long)puVar34 + 2);
          iVar46 = iVar48 + 2;
          if (local_f8 == 0) {
            local_f8 = 0;
          }
          else {
            UVar50 = (ms->window).lowLimit;
            UVar25 = iVar46 - uVar37;
            if (iVar46 - UVar50 <= uVar37) {
              UVar25 = UVar50;
            }
            if (ms->loadedDictEnd != 0) {
              UVar25 = UVar50;
            }
            uVar49 = iVar46 - uVar47;
            pBVar28 = pBVar11;
            if (uVar49 < uVar8) {
              pBVar28 = pBVar12;
            }
            if (((2 < iVar30 - uVar49) && (uVar47 < iVar46 - UVar25)) &&
               (*(int *)puVar43 == *(int *)(pBVar28 + uVar49))) {
              puVar35 = iEnd;
              if (uVar49 < uVar8) {
                puVar35 = puVar26;
              }
              sVar20 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar34 + 6),(BYTE *)((long)(pBVar28 + uVar49) + 4)
                                  ,(BYTE *)iEnd,(BYTE *)puVar35,iStart);
              if (sVar20 < 0xfffffffffffffffc) {
                uVar32 = (int)local_f8 + 1;
                uVar49 = 0x1f;
                if (uVar32 != 0) {
                  for (; uVar32 >> uVar49 == 0; uVar49 = uVar49 - 1) {
                  }
                }
                if ((int)((uVar49 ^ 0x1f) + (int)local_100 * 4 + -0x1e) <
                    (int)(BYTE *)(sVar20 + 4) * 4) {
                  local_f8 = 0;
                  local_100 = (BYTE *)(sVar20 + 4);
                  local_e8 = puVar43;
                }
              }
            }
          }
          uVar49 = (ms->cParams).minMatch;
          if (uVar49 - 6 < 2) {
            bVar7 = (byte)(ms->cParams).chainLog;
            uVar38 = 1 << (bVar7 & 0x1f);
            pUVar13 = ms->chainTable;
            pBVar28 = (ms->window).base;
            pBVar19 = (ms->window).dictBase;
            uVar32 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
            UVar50 = (ms->window).lowLimit;
            uVar49 = (uint)((long)puVar43 - (long)pBVar28);
            UVar25 = uVar49 - uVar32;
            if (uVar49 - UVar50 <= uVar32) {
              UVar25 = UVar50;
            }
            if (ms->loadedDictEnd != 0) {
              UVar25 = UVar50;
            }
            uVar32 = uVar49 - uVar38;
            if (uVar49 < uVar38) {
              uVar32 = 0;
            }
            uVar33 = (ms->window).dictLimit;
            iVar48 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
            pUVar14 = ms->hashTable;
            uVar40 = (ulong)ms->nextToUpdate;
            cVar18 = (char)(ms->cParams).hashLog;
            if (ms->nextToUpdate < uVar49) {
              do {
                uVar45 = (ulong)(*(long *)(pBVar28 + uVar40) * -0x30e4432340650000) >>
                         (0x40U - cVar18 & 0x3f);
                pUVar13[(uint)uVar40 & ~(-1 << (bVar7 & 0x1f))] = pUVar14[uVar45];
                pUVar14[uVar45] = (uint)uVar40;
                uVar40 = uVar40 + 1;
              } while (uVar40 < ((long)puVar43 - (long)pBVar28 & 0xffffffffU));
            }
            ms->nextToUpdate = uVar49;
            uVar40 = *puVar43;
            uVar44 = pUVar14[uVar40 * -0x30e4432340650000 >> (-cVar18 & 0x3fU)];
            if (uVar44 < UVar25) goto LAB_0061ca08;
            local_140 = 999999999;
            pBVar29 = (BYTE *)0x3;
            do {
              if (uVar44 < uVar33) {
                if (*(int *)(pBVar19 + uVar44) == *(int *)puVar43) {
                  sVar20 = ZSTD_count_2segments
                                     ((BYTE *)((long)puVar34 + 6),pBVar19 + (ulong)uVar44 + 4,
                                      (BYTE *)iEnd,pBVar19 + uVar33,pBVar28 + uVar33);
                  pBVar22 = (BYTE *)(sVar20 + 4);
                }
                else {
LAB_0061c3be:
                  pBVar22 = (BYTE *)0x0;
                }
              }
              else {
                puVar35 = (ulong *)(pBVar28 + uVar44);
                if (pBVar29[(long)puVar35] != *(BYTE *)((long)puVar43 + (long)pBVar29))
                goto LAB_0061c3be;
                puVar27 = puVar43;
                if (puVar43 < puVar1) {
                  uVar23 = *puVar35 ^ uVar40;
                  uVar45 = 0;
                  if (uVar23 != 0) {
                    for (; (uVar23 >> uVar45 & 1) == 0; uVar45 = uVar45 + 1) {
                    }
                  }
                  pBVar22 = (BYTE *)(uVar45 >> 3 & 0x1fffffff);
                  puVar27 = (ulong *)((long)puVar34 + 10);
                  if (*puVar35 == uVar40) {
                    do {
                      puVar35 = puVar35 + 1;
                      if (puVar1 <= puVar27) goto LAB_0061c3c5;
                      uVar45 = *puVar27;
                      uVar42 = uVar45 ^ *puVar35;
                      uVar23 = 0;
                      if (uVar42 != 0) {
                        for (; (uVar42 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
                        }
                      }
                      pBVar22 = (BYTE *)((long)puVar27 +
                                        ((uVar23 >> 3 & 0x1fffffff) - (long)puVar43));
                      puVar27 = puVar27 + 1;
                    } while (*puVar35 == uVar45);
                  }
                }
                else {
LAB_0061c3c5:
                  if ((puVar27 < puVar2) && ((int)*puVar35 == (int)*puVar27)) {
                    puVar27 = (ulong *)((long)puVar27 + 4);
                    puVar35 = (ulong *)((long)puVar35 + 4);
                  }
                  if ((puVar27 < puVar3) && ((short)*puVar35 == (short)*puVar27)) {
                    puVar27 = (ulong *)((long)puVar27 + 2);
                    puVar35 = (ulong *)((long)puVar35 + 2);
                  }
                  if (puVar27 < iEnd) {
                    puVar27 = (ulong *)((long)puVar27 + (ulong)((BYTE)*puVar35 == (BYTE)*puVar27));
                  }
                  pBVar22 = (BYTE *)((long)puVar27 - (long)puVar43);
                }
              }
              if ((pBVar29 < pBVar22) &&
                 (local_140 = (ulong)((uVar49 + 2) - uVar44), pBVar29 = pBVar22,
                 (ulong *)((long)puVar43 + (long)pBVar22) == iEnd)) {
                bVar16 = false;
              }
              else {
                pBVar22 = pBVar29;
                if (uVar32 < uVar44) {
                  uVar44 = pUVar13[uVar44 & uVar38 - 1];
                  bVar16 = true;
                }
                else {
                  bVar16 = false;
                }
              }
            } while (((bVar16) && (UVar25 <= uVar44)) &&
                    (iVar48 = iVar48 + -1, pBVar29 = pBVar22, iVar48 != 0));
          }
          else if (uVar49 == 5) {
            bVar7 = (byte)(ms->cParams).chainLog;
            uVar38 = 1 << (bVar7 & 0x1f);
            pUVar13 = ms->chainTable;
            pBVar28 = (ms->window).base;
            pBVar19 = (ms->window).dictBase;
            uVar32 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
            UVar50 = (ms->window).lowLimit;
            uVar49 = (uint)((long)puVar43 - (long)pBVar28);
            UVar25 = uVar49 - uVar32;
            if (uVar49 - UVar50 <= uVar32) {
              UVar25 = UVar50;
            }
            if (ms->loadedDictEnd != 0) {
              UVar25 = UVar50;
            }
            uVar32 = uVar49 - uVar38;
            if (uVar49 < uVar38) {
              uVar32 = 0;
            }
            uVar33 = (ms->window).dictLimit;
            iVar48 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
            pUVar14 = ms->hashTable;
            uVar40 = (ulong)ms->nextToUpdate;
            cVar18 = (char)(ms->cParams).hashLog;
            if (ms->nextToUpdate < uVar49) {
              do {
                uVar45 = (ulong)(*(long *)(pBVar28 + uVar40) * -0x30e4432345000000) >>
                         (0x40U - cVar18 & 0x3f);
                pUVar13[(uint)uVar40 & ~(-1 << (bVar7 & 0x1f))] = pUVar14[uVar45];
                pUVar14[uVar45] = (uint)uVar40;
                uVar40 = uVar40 + 1;
              } while (uVar40 < ((long)puVar43 - (long)pBVar28 & 0xffffffffU));
            }
            ms->nextToUpdate = uVar49;
            uVar40 = *puVar43;
            uVar44 = pUVar14[uVar40 * -0x30e4432345000000 >> (-cVar18 & 0x3fU)];
            if (uVar44 < UVar25) {
LAB_0061ca08:
              pBVar22 = (BYTE *)0x3;
              local_140 = 999999999;
            }
            else {
              local_140 = 999999999;
              pBVar29 = (BYTE *)0x3;
              do {
                if (uVar44 < uVar33) {
                  if (*(int *)(pBVar19 + uVar44) == *(int *)puVar43) {
                    sVar20 = ZSTD_count_2segments
                                       ((BYTE *)((long)puVar34 + 6),pBVar19 + (ulong)uVar44 + 4,
                                        (BYTE *)iEnd,pBVar19 + uVar33,pBVar28 + uVar33);
                    pBVar22 = (BYTE *)(sVar20 + 4);
                  }
                  else {
LAB_0061c693:
                    pBVar22 = (BYTE *)0x0;
                  }
                }
                else {
                  puVar35 = (ulong *)(pBVar28 + uVar44);
                  if (pBVar29[(long)puVar35] != *(BYTE *)((long)puVar43 + (long)pBVar29))
                  goto LAB_0061c693;
                  puVar27 = puVar43;
                  if (puVar43 < puVar1) {
                    uVar23 = *puVar35 ^ uVar40;
                    uVar45 = 0;
                    if (uVar23 != 0) {
                      for (; (uVar23 >> uVar45 & 1) == 0; uVar45 = uVar45 + 1) {
                      }
                    }
                    pBVar22 = (BYTE *)(uVar45 >> 3 & 0x1fffffff);
                    puVar27 = (ulong *)((long)puVar34 + 10);
                    if (*puVar35 == uVar40) {
                      do {
                        puVar35 = puVar35 + 1;
                        if (puVar1 <= puVar27) goto LAB_0061c69a;
                        uVar45 = *puVar27;
                        uVar42 = uVar45 ^ *puVar35;
                        uVar23 = 0;
                        if (uVar42 != 0) {
                          for (; (uVar42 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
                          }
                        }
                        pBVar22 = (BYTE *)((long)puVar27 +
                                          ((uVar23 >> 3 & 0x1fffffff) - (long)puVar43));
                        puVar27 = puVar27 + 1;
                      } while (*puVar35 == uVar45);
                    }
                  }
                  else {
LAB_0061c69a:
                    if ((puVar27 < puVar2) && ((int)*puVar35 == (int)*puVar27)) {
                      puVar27 = (ulong *)((long)puVar27 + 4);
                      puVar35 = (ulong *)((long)puVar35 + 4);
                    }
                    if ((puVar27 < puVar3) && ((short)*puVar35 == (short)*puVar27)) {
                      puVar27 = (ulong *)((long)puVar27 + 2);
                      puVar35 = (ulong *)((long)puVar35 + 2);
                    }
                    if (puVar27 < iEnd) {
                      puVar27 = (ulong *)((long)puVar27 + (ulong)((BYTE)*puVar35 == (BYTE)*puVar27))
                      ;
                    }
                    pBVar22 = (BYTE *)((long)puVar27 - (long)puVar43);
                  }
                }
                if ((pBVar29 < pBVar22) &&
                   (local_140 = (ulong)((uVar49 + 2) - uVar44), pBVar29 = pBVar22,
                   (ulong *)((long)puVar43 + (long)pBVar22) == iEnd)) {
                  bVar16 = false;
                }
                else {
                  pBVar22 = pBVar29;
                  if (uVar32 < uVar44) {
                    uVar44 = pUVar13[uVar44 & uVar38 - 1];
                    bVar16 = true;
                  }
                  else {
                    bVar16 = false;
                  }
                }
              } while (((bVar16) && (UVar25 <= uVar44)) &&
                      (iVar48 = iVar48 + -1, pBVar29 = pBVar22, iVar48 != 0));
            }
          }
          else {
            bVar7 = (byte)(ms->cParams).chainLog;
            uVar38 = 1 << (bVar7 & 0x1f);
            pUVar13 = ms->chainTable;
            pBVar28 = (ms->window).base;
            pBVar19 = (ms->window).dictBase;
            uVar32 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
            UVar50 = (ms->window).lowLimit;
            uVar49 = (uint)((long)puVar43 - (long)pBVar28);
            UVar25 = uVar49 - uVar32;
            if (uVar49 - UVar50 <= uVar32) {
              UVar25 = UVar50;
            }
            if (ms->loadedDictEnd != 0) {
              UVar25 = UVar50;
            }
            uVar32 = uVar49 - uVar38;
            if (uVar49 < uVar38) {
              uVar32 = 0;
            }
            uVar33 = (ms->window).dictLimit;
            iVar48 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
            pUVar14 = ms->hashTable;
            uVar40 = (ulong)ms->nextToUpdate;
            cVar18 = (char)(ms->cParams).hashLog;
            if (ms->nextToUpdate < uVar49) {
              do {
                uVar44 = (uint)(*(int *)(pBVar28 + uVar40) * -0x61c8864f) >> (0x20U - cVar18 & 0x1f)
                ;
                pUVar13[(uint)uVar40 & ~(-1 << (bVar7 & 0x1f))] = pUVar14[uVar44];
                pUVar14[uVar44] = (uint)uVar40;
                uVar40 = uVar40 + 1;
              } while (uVar40 < ((long)puVar43 - (long)pBVar28 & 0xffffffffU));
            }
            ms->nextToUpdate = uVar49;
            iVar31 = *(int *)puVar43;
            uVar44 = pUVar14[(uint)(iVar31 * -0x61c8864f) >> (-cVar18 & 0x1fU)];
            if (uVar44 < UVar25) goto LAB_0061ca08;
            local_140 = 999999999;
            pBVar29 = (BYTE *)0x3;
            do {
              if (uVar44 < uVar33) {
                if (*(int *)(pBVar19 + uVar44) == iVar31) {
                  sVar20 = ZSTD_count_2segments
                                     ((BYTE *)((long)puVar34 + 6),pBVar19 + (ulong)uVar44 + 4,
                                      (BYTE *)iEnd,pBVar19 + uVar33,pBVar28 + uVar33);
                  pBVar22 = (BYTE *)(sVar20 + 4);
                }
                else {
LAB_0061cc3a:
                  pBVar22 = (BYTE *)0x0;
                }
              }
              else {
                puVar35 = (ulong *)(pBVar28 + uVar44);
                if (pBVar29[(long)puVar35] != *(BYTE *)((long)puVar43 + (long)pBVar29))
                goto LAB_0061cc3a;
                puVar27 = puVar43;
                if (puVar43 < puVar1) {
                  uVar45 = *puVar43 ^ *puVar35;
                  uVar40 = 0;
                  if (uVar45 != 0) {
                    for (; (uVar45 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                    }
                  }
                  pBVar22 = (BYTE *)(uVar40 >> 3 & 0x1fffffff);
                  puVar27 = (ulong *)((long)puVar34 + 10);
                  if (*puVar35 == *puVar43) {
                    do {
                      puVar35 = puVar35 + 1;
                      if (puVar1 <= puVar27) goto LAB_0061cc41;
                      uVar40 = *puVar27;
                      uVar23 = uVar40 ^ *puVar35;
                      uVar45 = 0;
                      if (uVar23 != 0) {
                        for (; (uVar23 >> uVar45 & 1) == 0; uVar45 = uVar45 + 1) {
                        }
                      }
                      pBVar22 = (BYTE *)((long)puVar27 +
                                        ((uVar45 >> 3 & 0x1fffffff) - (long)puVar43));
                      puVar27 = puVar27 + 1;
                    } while (*puVar35 == uVar40);
                  }
                }
                else {
LAB_0061cc41:
                  if ((puVar27 < puVar2) && ((int)*puVar35 == (int)*puVar27)) {
                    puVar27 = (ulong *)((long)puVar27 + 4);
                    puVar35 = (ulong *)((long)puVar35 + 4);
                  }
                  if ((puVar27 < puVar3) && ((short)*puVar35 == (short)*puVar27)) {
                    puVar27 = (ulong *)((long)puVar27 + 2);
                    puVar35 = (ulong *)((long)puVar35 + 2);
                  }
                  if (puVar27 < iEnd) {
                    puVar27 = (ulong *)((long)puVar27 + (ulong)((BYTE)*puVar35 == (BYTE)*puVar27));
                  }
                  pBVar22 = (BYTE *)((long)puVar27 - (long)puVar43);
                }
              }
              if ((pBVar29 < pBVar22) &&
                 (local_140 = (ulong)((uVar49 + 2) - uVar44), pBVar29 = pBVar22,
                 (ulong *)((long)puVar43 + (long)pBVar22) == iEnd)) {
                bVar16 = false;
              }
              else {
                pBVar22 = pBVar29;
                if (uVar32 < uVar44) {
                  uVar44 = pUVar13[uVar44 & uVar38 - 1];
                  bVar16 = true;
                }
                else {
                  bVar16 = false;
                }
              }
            } while (((bVar16) && (UVar25 <= uVar44)) &&
                    (iVar48 = iVar48 + -1, pBVar29 = pBVar22, iVar48 != 0));
          }
          bVar16 = true;
          if ((BYTE *)0x3 < pBVar22) {
            uVar32 = (int)local_f8 + 1;
            uVar49 = 0x1f;
            if (uVar32 != 0) {
              for (; uVar32 >> uVar49 == 0; uVar49 = uVar49 - 1) {
              }
            }
            uVar32 = (int)local_140 + 1;
            iVar48 = 0x1f;
            if (uVar32 != 0) {
              for (; uVar32 >> iVar48 == 0; iVar48 = iVar48 + -1) {
              }
            }
            if ((int)((uVar49 ^ 0x1f) + (int)local_100 * 4 + -0x18) < (int)pBVar22 * 4 - iVar48) {
              bVar16 = false;
              local_f8 = local_140;
              local_100 = pBVar22;
              local_e8 = puVar43;
            }
          }
        } while (!bVar16);
LAB_0061ccef:
        if (local_f8 == 0) {
          UVar50 = 1;
          uVar49 = uVar47;
        }
        else {
          pBVar29 = (BYTE *)((long)local_e8 + (2 - (long)(pBVar11 + local_f8)));
          pBVar19 = iStart;
          pBVar28 = pBVar11;
          if ((uint)pBVar29 < uVar8) {
            pBVar19 = pBVar12 + uVar9;
            pBVar28 = pBVar12;
          }
          if ((local_b8 < local_e8) &&
             (uVar40 = (ulong)pBVar29 & 0xffffffff, pBVar19 < pBVar28 + uVar40)) {
            pBVar28 = pBVar28 + uVar40;
            do {
              pBVar28 = pBVar28 + -1;
              puVar43 = (ulong *)((long)local_e8 + -1);
              if ((*(BYTE *)puVar43 != *pBVar28) ||
                 (local_100 = local_100 + 1, local_e8 = puVar43, puVar43 <= local_b8)) break;
            } while (pBVar19 < pBVar28);
          }
          UVar50 = (int)local_f8 + 1;
          uVar49 = (int)local_f8 - 2;
          uVar39 = uVar47;
        }
        uVar47 = uVar49;
        uVar40 = (long)local_e8 - (long)local_b8;
        if (puVar4 < local_e8) {
          puVar34 = (ulong *)seqStore->lit;
          puVar43 = puVar34;
          puVar35 = local_b8;
          if (local_b8 <= puVar4) {
            puVar43 = (ulong *)((long)puVar34 + ((long)puVar4 - (long)local_b8));
            uVar45 = local_b8[1];
            *puVar34 = *local_b8;
            puVar34[1] = uVar45;
            puVar35 = puVar4;
            if (0x10 < (long)puVar4 - (long)local_b8) {
              lVar36 = 0x10;
              do {
                uVar17 = *(undefined8 *)((BYTE *)((long)local_b8 + lVar36) + 8);
                puVar5 = (undefined8 *)((long)puVar34 + lVar36);
                *puVar5 = *(undefined8 *)((long)local_b8 + lVar36);
                puVar5[1] = uVar17;
                pBVar28 = (BYTE *)((long)local_b8 + lVar36 + 0x10);
                uVar17 = *(undefined8 *)(pBVar28 + 8);
                puVar5[2] = *(undefined8 *)pBVar28;
                puVar5[3] = uVar17;
                lVar36 = lVar36 + 0x20;
              } while (puVar5 + 4 < puVar43);
            }
          }
          if (puVar35 < local_e8) {
            lVar36 = 0;
            do {
              *(BYTE *)((long)puVar43 + lVar36) = *(BYTE *)((long)puVar35 + lVar36);
              lVar36 = lVar36 + 1;
            } while ((long)local_e8 - (long)puVar35 != lVar36);
          }
        }
        else {
          puVar43 = (ulong *)seqStore->lit;
          uVar45 = local_b8[1];
          *puVar43 = *local_b8;
          puVar43[1] = uVar45;
          if (0x10 < uVar40) {
            pBVar28 = seqStore->lit;
            uVar45 = local_b8[3];
            *(ulong *)(pBVar28 + 0x10) = local_b8[2];
            *(ulong *)(pBVar28 + 0x18) = uVar45;
            if (0x20 < (long)uVar40) {
              lVar36 = 0;
              do {
                pBVar29 = (BYTE *)((long)local_b8 + lVar36 + 0x20);
                uVar17 = *(undefined8 *)(pBVar29 + 8);
                pBVar19 = pBVar28 + lVar36 + 0x20;
                *(undefined8 *)pBVar19 = *(undefined8 *)pBVar29;
                *(undefined8 *)(pBVar19 + 8) = uVar17;
                pBVar29 = (BYTE *)((long)local_b8 + lVar36 + 0x30);
                uVar17 = *(undefined8 *)(pBVar29 + 8);
                *(undefined8 *)(pBVar19 + 0x10) = *(undefined8 *)pBVar29;
                *(undefined8 *)(pBVar19 + 0x18) = uVar17;
                lVar36 = lVar36 + 0x20;
              } while (pBVar19 + 0x20 < pBVar28 + uVar40);
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar40;
        if (0xffff < uVar40) {
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
        psVar15 = seqStore->sequences;
        psVar15->litLength = (U16)uVar40;
        psVar15->offset = UVar50;
        if ((BYTE *)0xffff < local_100 + -3) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar15 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar15->matchLength = (U16)(local_100 + -3);
        seqStore->sequences = psVar15 + 1;
        puVar43 = (ulong *)((long)local_e8 + (long)local_100);
        local_b8 = puVar43;
        do {
          if (puVar6 < puVar43) break;
          iVar46 = (int)puVar43 - (int)pBVar11;
          UVar50 = (ms->window).lowLimit;
          UVar25 = iVar46 - uVar37;
          if (iVar46 - UVar50 <= uVar37) {
            UVar25 = UVar50;
          }
          if (ms->loadedDictEnd != 0) {
            UVar25 = UVar50;
          }
          uVar49 = iVar46 - uVar39;
          pBVar28 = pBVar11;
          if (uVar49 < uVar8) {
            pBVar28 = pBVar12;
          }
          if (((iVar30 - uVar49 < 3) || (iVar46 - UVar25 <= uVar39)) ||
             ((int)*puVar43 != *(int *)(pBVar28 + uVar49))) {
            bVar16 = false;
            uVar49 = uVar39;
          }
          else {
            puVar34 = iEnd;
            if (uVar49 < uVar8) {
              puVar34 = puVar26;
            }
            sVar20 = ZSTD_count_2segments
                               ((BYTE *)((long)puVar43 + 4),(BYTE *)((long)(pBVar28 + uVar49) + 4),
                                (BYTE *)iEnd,(BYTE *)puVar34,iStart);
            if (local_b8 <= puVar4) {
              puVar34 = (ulong *)seqStore->lit;
              uVar40 = local_b8[1];
              *puVar34 = *local_b8;
              puVar34[1] = uVar40;
            }
            psVar15 = seqStore->sequences;
            psVar15->litLength = 0;
            psVar15->offset = 1;
            if (0xffff < sVar20 + 1) {
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar15 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar15->matchLength = (U16)(sVar20 + 1);
            seqStore->sequences = psVar15 + 1;
            puVar43 = (ulong *)((long)puVar43 + sVar20 + 4);
            bVar16 = true;
            uVar49 = uVar47;
            uVar47 = uVar39;
            local_b8 = puVar43;
          }
          uVar39 = uVar49;
        } while (bVar16);
      }
    } while (puVar43 < puVar6);
  }
  *rep = uVar47;
  rep[1] = uVar39;
  return (long)iEnd - (long)local_b8;
}

Assistant:

size_t ZSTD_compressBlock_lazy2_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)

{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 2);
}